

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3ExprAlloc(sqlite3 *db,int op,Token *pToken,int dequote)

{
  long lVar1;
  int iVar2;
  Expr *__s;
  int in_ECX;
  long *in_RDX;
  int in_ESI;
  long in_FS_OFFSET;
  int nExtra;
  Expr *pNew;
  int iValue;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar3;
  sqlite3 *db_00;
  undefined4 in_stack_ffffffffffffffe0;
  u8 uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  db_00 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  iVar3 = 0;
  if ((in_RDX != (long *)0x0) &&
     (((in_ESI != 0x9c || (*in_RDX == 0)) ||
      (iVar2 = sqlite3GetInt32((char *)CONCAT44(0x9c,in_stack_ffffffffffffffe0),(int *)in_RDX),
      iVar2 == 0)))) {
    iVar3 = (int)in_RDX[1] + 1;
  }
  uVar4 = (u8)in_ESI;
  __s = (Expr *)sqlite3DbMallocRawNN(db_00,CONCAT44(iVar3,in_stack_ffffffffffffffc0));
  if (__s != (Expr *)0x0) {
    memset(__s,0,0x48);
    __s->op = uVar4;
    __s->iAgg = -1;
    if (in_RDX != (long *)0x0) {
      if (iVar3 == 0) {
        __s->flags = __s->flags | 0x20800800;
        (__s->u).iValue = 0;
      }
      else {
        (__s->u).zToken = (char *)(__s + 1);
        if ((int)in_RDX[1] != 0) {
          memcpy((__s->u).zToken,(void *)*in_RDX,(ulong)*(uint *)(in_RDX + 1));
        }
        (__s->u).zToken[*(uint *)(in_RDX + 1)] = '\0';
        if ((in_ECX != 0) && ((""[(byte)*(__s->u).zToken] & 0x80) != 0)) {
          sqlite3DequoteExpr((Expr *)0x1bd084);
        }
      }
    }
    __s->nHeight = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __s;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAlloc(
  sqlite3 *db,            /* Handle for sqlite3DbMallocRawNN() */
  int op,                 /* Expression opcode */
  const Token *pToken,    /* Token argument.  Might be NULL */
  int dequote             /* True to dequote */
){
  Expr *pNew;
  int nExtra = 0;
  int iValue = 0;

  assert( db!=0 );
  if( pToken ){
    if( op!=TK_INTEGER || pToken->z==0
          || sqlite3GetInt32(pToken->z, &iValue)==0 ){
      nExtra = pToken->n+1;  /* tag-20240227-a */
      assert( iValue>=0 );
    }
  }
  pNew = sqlite3DbMallocRawNN(db, sizeof(Expr)+nExtra);
  if( pNew ){
    memset(pNew, 0, sizeof(Expr));
    pNew->op = (u8)op;
    pNew->iAgg = -1;
    if( pToken ){
      if( nExtra==0 ){
        pNew->flags |= EP_IntValue|EP_Leaf|(iValue?EP_IsTrue:EP_IsFalse);
        pNew->u.iValue = iValue;
      }else{
        pNew->u.zToken = (char*)&pNew[1];
        assert( pToken->z!=0 || pToken->n==0 );
        if( pToken->n ) memcpy(pNew->u.zToken, pToken->z, pToken->n);
        pNew->u.zToken[pToken->n] = 0;
        if( dequote && sqlite3Isquote(pNew->u.zToken[0]) ){
          sqlite3DequoteExpr(pNew);
        }
      }
    }
#if SQLITE_MAX_EXPR_DEPTH>0
    pNew->nHeight = 1;
#endif
  }
  return pNew;
}